

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

Expression **
wasm::Properties::getImmediateFallthroughPtr
          (Expression **currp,PassOptions *passOptions,Module *module,FallthroughBehavior behavior)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  RefCast *pRVar4;
  RefAs *pRVar5;
  BrOn *pBVar6;
  BrOn *br_1;
  RefAs *as_1;
  RefCast *as;
  EffectAnalyzer local_1d8;
  Try *local_78;
  Try *tryy;
  Break *br;
  If *local_60;
  If *iff;
  Loop *loop;
  Block *block;
  LocalSet *set;
  Expression *local_38;
  Expression *curr;
  Module *pMStack_28;
  FallthroughBehavior behavior_local;
  Module *module_local;
  PassOptions *passOptions_local;
  Expression **currp_local;
  
  local_38 = *currp;
  set._4_4_ = 1;
  curr._4_4_ = behavior;
  pMStack_28 = module;
  module_local = (Module *)passOptions;
  passOptions_local = (PassOptions *)currp;
  bVar1 = wasm::Type::operator==(&local_38->type,(BasicType *)((long)&set + 4));
  if (bVar1) {
    return (Expression **)passOptions_local;
  }
  block = (Block *)Expression::dynCast<wasm::LocalSet>(local_38);
  if (block == (Block *)0x0) {
    loop = (Loop *)Expression::dynCast<wasm::Block>(local_38);
    if ((Block *)loop == (Block *)0x0) {
      iff = (If *)Expression::dynCast<wasm::Loop>(local_38);
      if (iff != (If *)0x0) {
        return &iff->ifFalse;
      }
      local_60 = Expression::dynCast<wasm::If>(local_38);
      if (local_60 == (If *)0x0) {
        tryy = (Try *)Expression::dynCast<wasm::Break>(local_38);
        if (tryy == (Try *)0x0) {
          local_78 = Expression::dynCast<wasm::Try>(local_38);
          if (local_78 == (Try *)0x0) {
            pRVar4 = Expression::dynCast<wasm::RefCast>(local_38);
            if (pRVar4 != (RefCast *)0x0) {
              return &pRVar4->ref;
            }
            pRVar5 = Expression::dynCast<wasm::RefAs>(local_38);
            if (pRVar5 == (RefAs *)0x0) {
              pBVar6 = Expression::dynCast<wasm::BrOn>(local_38);
              if (pBVar6 != (BrOn *)0x0) {
                return &pBVar6->ref;
              }
            }
            else if ((pRVar5->op != AnyConvertExtern) && (pRVar5->op != ExternConvertAny)) {
              return &pRVar5->value;
            }
          }
          else {
            EffectAnalyzer::EffectAnalyzer
                      (&local_1d8,(PassOptions *)module_local,pMStack_28,local_78->body);
            bVar1 = EffectAnalyzer::throws(&local_1d8);
            EffectAnalyzer::~EffectAnalyzer(&local_1d8);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              return &local_78->body;
            }
          }
        }
        else if (((((Expression *)
                    (tryy->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                    data != (Expression *)0x0) && (tryy->body != (Expression *)0x0)) &&
                 (curr._4_4_ == AllowTeeBrIf)) &&
                (bVar1 = EffectAnalyzer::canReorder
                                   ((PassOptions *)module_local,pMStack_28,
                                    (Expression *)
                                    (tryy->catchTags).
                                    super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data,
                                    tryy->body), bVar1)) {
          return &tryy->body;
        }
      }
      else if (local_60->ifFalse != (Expression *)0x0) {
        br._4_4_ = 1;
        bVar1 = wasm::Type::operator==(&local_60->ifTrue->type,(BasicType *)((long)&br + 4));
        if (bVar1) {
          return &local_60->ifFalse;
        }
        br._0_4_ = 1;
        bVar1 = wasm::Type::operator==(&local_60->ifFalse->type,(BasicType *)&br);
        if (bVar1) {
          return &local_60->ifTrue;
        }
      }
    }
    else {
      bVar1 = IString::is(&(((Block *)loop)->name).super_IString);
      if ((!bVar1) &&
         (sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&loop->body), sVar2 != 0)) {
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&loop->body);
        return ppEVar3;
      }
    }
  }
  else {
    bVar1 = LocalSet::isTee((LocalSet *)block);
    if ((bVar1) && (curr._4_4_ == AllowTeeBrIf)) {
      return (Expression **)&(block->name).super_IString.str._M_str;
    }
  }
  return (Expression **)passOptions_local;
}

Assistant:

inline Expression** getImmediateFallthroughPtr(
  Expression** currp,
  const PassOptions& passOptions,
  Module& module,
  FallthroughBehavior behavior = FallthroughBehavior::AllowTeeBrIf) {
  auto* curr = *currp;
  // If the current node is unreachable, there is no value
  // falling through.
  if (curr->type == Type::unreachable) {
    return currp;
  }
  if (auto* set = curr->dynCast<LocalSet>()) {
    if (set->isTee() && behavior == FallthroughBehavior::AllowTeeBrIf) {
      return &set->value;
    }
  } else if (auto* block = curr->dynCast<Block>()) {
    // if no name, we can't be broken to, and then can look at the fallthrough
    if (!block->name.is() && block->list.size() > 0) {
      return &block->list.back();
    }
  } else if (auto* loop = curr->dynCast<Loop>()) {
    return &loop->body;
  } else if (auto* iff = curr->dynCast<If>()) {
    if (iff->ifFalse) {
      // Perhaps just one of the two actually returns.
      if (iff->ifTrue->type == Type::unreachable) {
        return &iff->ifFalse;
      } else if (iff->ifFalse->type == Type::unreachable) {
        return &iff->ifTrue;
      }
    }
  } else if (auto* br = curr->dynCast<Break>()) {
    // Note that we must check for the ability to reorder the condition and the
    // value, as the value is first, which would be a problem here:
    //
    //  (br_if ..
    //    (local.get $x)    ;; value
    //    (tee_local $x ..) ;; condition
    //  )
    //
    // We must not say that the fallthrough value is $x, since it is the
    // *earlier* value of $x before the tee that is passed out. But, if we can
    // reorder then that means that the value could have been last and so we do
    // know the fallthrough in that case.
    if (br->condition && br->value &&
        behavior == FallthroughBehavior::AllowTeeBrIf &&
        EffectAnalyzer::canReorder(
          passOptions, module, br->condition, br->value)) {
      return &br->value;
    }
  } else if (auto* tryy = curr->dynCast<Try>()) {
    if (!EffectAnalyzer(passOptions, module, tryy->body).throws()) {
      return &tryy->body;
    }
  } else if (auto* as = curr->dynCast<RefCast>()) {
    return &as->ref;
  } else if (auto* as = curr->dynCast<RefAs>()) {
    // Extern conversions are not casts and actually produce new values.
    // Treating them as fallthroughs would lead to misoptimizations of
    // subsequent casts.
    if (as->op != AnyConvertExtern && as->op != ExternConvertAny) {
      return &as->value;
    }
  } else if (auto* br = curr->dynCast<BrOn>()) {
    return &br->ref;
  }
  return currp;
}